

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_pa_stream *
ma_device__pa_stream_new__pulse
          (ma_device *pDevice,char *pStreamName,ma_pa_sample_spec *ss,ma_pa_channel_map *cmap)

{
  char cVar1;
  long lVar2;
  ma_pa_stream *pmVar3;
  char actualStreamName [256];
  char local_118 [256];
  
  if (pStreamName == (char *)0x0) {
    cVar1 = 'm';
    lVar2 = 0;
    do {
      local_118[lVar2] = cVar1;
      cVar1 = "miniaudio:"[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 10);
    local_118[10] = 0;
    ma_itoa_s(ma_device__pa_stream_new__pulse::g_StreamCounter,local_118 + 8,0xf8,10);
  }
  else {
    lVar2 = 0;
    do {
      if (pStreamName[lVar2] == '\0') goto LAB_0010e70c;
      local_118[lVar2] = pStreamName[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xff);
    lVar2 = 0xff;
LAB_0010e70c:
    local_118[lVar2] = '\0';
  }
  ma_device__pa_stream_new__pulse::g_StreamCounter =
       ma_device__pa_stream_new__pulse::g_StreamCounter + 1;
  pmVar3 = (ma_pa_stream *)
           (*(pDevice->pContext->field_21).alsa.snd_pcm_hw_params_get_buffer_size)
                     ((pDevice->field_23).pulse.pPulseContext,local_118,ss,cmap);
  return pmVar3;
}

Assistant:

static ma_pa_stream* ma_device__pa_stream_new__pulse(ma_device* pDevice, const char* pStreamName, const ma_pa_sample_spec* ss, const ma_pa_channel_map* cmap)
{
    static int g_StreamCounter = 0;
    char actualStreamName[256];

    if (pStreamName != NULL) {
        ma_strncpy_s(actualStreamName, sizeof(actualStreamName), pStreamName, (size_t)-1);
    } else {
        ma_strcpy_s(actualStreamName, sizeof(actualStreamName), "miniaudio:");
        ma_itoa_s(g_StreamCounter, actualStreamName + 8, sizeof(actualStreamName)-8, 10);  /* 8 = strlen("miniaudio:") */
    }
    g_StreamCounter += 1;

    return ((ma_pa_stream_new_proc)pDevice->pContext->pulse.pa_stream_new)((ma_pa_context*)pDevice->pulse.pPulseContext, actualStreamName, ss, cmap);
}